

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

_Bool malloc_conf_init_check_deps(void)

{
  _Bool local_1;
  
  if ((!duckdb_je_opt_prof_leak_error) || (duckdb_je_opt_prof_final)) {
    duckdb_je_opt_debug_double_free_max_scan = 0;
    local_1 = false;
  }
  else {
    duckdb_je_malloc_printf("<jemalloc>: prof_leak_error is set w/o prof_final.\n");
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool
malloc_conf_init_check_deps(void) {
	if (opt_prof_leak_error && !opt_prof_final) {
		malloc_printf("<jemalloc>: prof_leak_error is set w/o "
		    "prof_final.\n");
		return true;
	}
	/* To emphasize in the stats output that opt is disabled when !debug. */
	if (!config_debug) {
		opt_debug_double_free_max_scan = 0;
	}

	return false;
}